

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::StringFeatureType::StringFeatureType
          (StringFeatureType *this,StringFeatureType *from)

{
  void *pvVar1;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__StringFeatureType_003b83c0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  return;
}

Assistant:

StringFeatureType::StringFeatureType(const StringFeatureType& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.StringFeatureType)
}